

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_2U>::getUNORM
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_char,_2U> *this,uint32_t numChannels,uint32_t targetBits,uint32_t sBits)

{
  pointer puVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t y;
  uint uVar5;
  uint32_t c;
  uint32_t uVar6;
  uint32_t x;
  uint uVar7;
  allocator_type local_41;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  uint local_34;
  
  local_40 = __return_storage_ptr__;
  if (2 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x325,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 2>::getUNORM(uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 2]"
                 );
  }
  if ((targetBits < 0x21) && ((0x100010100U >> ((ulong)targetBits & 0x3f) & 1) != 0)) {
    local_34 = targetBits >> 3;
    uVar3 = -(uint)(sBits == 0) |
            ~(-1 << ((byte)sBits & 0x1f)) << ((char)targetBits - (byte)sBits & 0x1f);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,
               (ulong)(local_34 * numChannels * (this->super_Image).height *
                      (this->super_Image).width),&local_41);
    for (uVar5 = 0; uVar5 < (this->super_Image).height; uVar5 = uVar5 + 1) {
      for (uVar7 = 0; uVar7 < (this->super_Image).width; uVar7 = uVar7 + 1) {
        for (uVar6 = 0; numChannels != uVar6; uVar6 = uVar6 + 1) {
          uVar2 = imageio::convertUNORM
                            ((uint)*(byte *)((long)this->pixels +
                                            (((ulong)((this->super_Image).width * uVar5 + uVar7) * 2
                                             + 1) - (ulong)(uVar6 == 0))),8,targetBits);
          puVar1 = (local_40->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar4 = (((this->super_Image).width * uVar5 + uVar7) * numChannels + uVar6) * local_34;
          if (targetBits == 0x20) {
            *(uint32_t *)(puVar1 + uVar4) = uVar2 & uVar3;
          }
          else if (targetBits == 0x10) {
            *(ushort *)(puVar1 + uVar4) = (ushort)uVar2 & (ushort)uVar3;
          }
          else if (targetBits == 8) {
            puVar1[uVar4] = (byte)uVar2 & (byte)uVar3;
          }
        }
      }
    }
    return local_40;
  }
  __assert_fail("targetBits == 8 || targetBits == 16 || targetBits == 32",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x326,
                "virtual std::vector<uint8_t> ImageT<unsigned char, 2>::getUNORM(uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 2]"
               );
}

Assistant:

virtual std::vector<uint8_t> getUNORM(uint32_t numChannels, uint32_t targetBits, uint32_t sBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 8 || targetBits == 16 || targetBits == 32);

        const uint32_t sourceBits = sizeof(componentType) * 8;
        const uint32_t targetBytes = targetBits / 8;
        const uint32_t mask = (sBits == 0) ? 0xFFFFFFFF : ((1u << sBits) - 1u) << (targetBits - sBits);
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto sourceValue = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : Color::one());
                    const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, targetBits);
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (targetBytes == 1) {
                        const auto outValue = static_cast<uint8_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    } else if (targetBytes == 2) {
                        const auto outValue = static_cast<uint16_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<uint32_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    }
                }
            }
        }

        return data;
    }